

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Module.cpp
# Opt level: O3

string * __thiscall Module::print_abi_cxx11_(string *__return_storage_ptr__,Module *this)

{
  _List_node_base *p_Var1;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  p_Var1 = (_List_node_base *)&this->global_list_;
  while (p_Var1 = (((_List_base<GlobalVariable_*,_std::allocator<GlobalVariable_*>_> *)
                   &p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)&this->global_list_) {
    (*(code *)**(undefined8 **)p_Var1[1]._M_next)(local_50);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50[0]);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  p_Var1 = (_List_node_base *)&this->function_list_;
  while (p_Var1 = (((_List_base<Function_*,_std::allocator<Function_*>_> *)&p_Var1->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)&this->function_list_) {
    (*(code *)**(undefined8 **)p_Var1[1]._M_next)(local_50);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50[0]);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Module::print()
{
    std::string module_ir;
    for ( auto global_val : this->global_list_)
    {
        module_ir += global_val->print();
        module_ir += "\n";
    }
    for ( auto func : this->function_list_)
    {
        module_ir += func->print();
        module_ir += "\n";
    }
    return module_ir;
}